

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void __thiscall flatbuffers::Parser::Next(Parser *this)

{
  char cVar1;
  byte *pbVar2;
  char *pcVar3;
  int iVar4;
  char *__beg;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  string ch;
  char *start_2;
  char *local_100;
  char *start_1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8;
  char *local_a8;
  char *start;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  byte local_12;
  byte local_11;
  char c;
  Parser *pPStack_10;
  bool seen_newline;
  Parser *this_local;
  
  pPStack_10 = this;
  std::__cxx11::string::clear();
  local_11 = 0;
  do {
    pbVar2 = (byte *)this->cursor_;
    this->cursor_ = (char *)(pbVar2 + 1);
    local_12 = *pbVar2;
    this->token_ = (int)(char)local_12;
    switch(local_12) {
    case 0:
      this->cursor_ = this->cursor_ + -1;
      this->token_ = 0;
      return;
    default:
switchD_0012e7cf_caseD_1:
      iVar4 = isalpha((uint)local_12);
      if (iVar4 != 0) {
        local_100 = this->cursor_ + -1;
        while( true ) {
          iVar4 = isalnum((uint)(byte)*this->cursor_);
          bVar5 = true;
          if (iVar4 == 0) {
            bVar5 = *this->cursor_ == '_';
          }
          if (!bVar5) break;
          this->cursor_ = this->cursor_ + 1;
        }
        std::__cxx11::string::clear();
        std::__cxx11::string::append<char_const*,void>
                  ((string *)&this->attribute_,local_100,this->cursor_);
        bVar5 = std::operator==(&this->attribute_,"");
        if (bVar5) {
          this->token_ = 0xb;
          return;
        }
        bVar5 = std::operator==(&this->attribute_,"");
        if (bVar5) {
          this->token_ = 0xc;
          return;
        }
        bVar5 = std::operator==(&this->attribute_,"bool");
        if (bVar5) {
          this->token_ = 0xd;
          return;
        }
        bVar5 = std::operator==(&this->attribute_,"byte");
        if (bVar5) {
          this->token_ = 0xe;
          return;
        }
        bVar5 = std::operator==(&this->attribute_,"ubyte");
        if (bVar5) {
          this->token_ = 0xf;
          return;
        }
        bVar5 = std::operator==(&this->attribute_,"short");
        if (bVar5) {
          this->token_ = 0x10;
          return;
        }
        bVar5 = std::operator==(&this->attribute_,"ushort");
        if (bVar5) {
          this->token_ = 0x11;
          return;
        }
        bVar5 = std::operator==(&this->attribute_,"int");
        if (bVar5) {
          this->token_ = 0x12;
          return;
        }
        bVar5 = std::operator==(&this->attribute_,"uint");
        if (bVar5) {
          this->token_ = 0x13;
          return;
        }
        bVar5 = std::operator==(&this->attribute_,"long");
        if (bVar5) {
          this->token_ = 0x14;
          return;
        }
        bVar5 = std::operator==(&this->attribute_,"ulong");
        if (bVar5) {
          this->token_ = 0x15;
          return;
        }
        bVar5 = std::operator==(&this->attribute_,"float");
        if (bVar5) {
          this->token_ = 0x16;
          return;
        }
        bVar5 = std::operator==(&this->attribute_,"double");
        if (bVar5) {
          this->token_ = 0x17;
          return;
        }
        bVar5 = std::operator==(&this->attribute_,"string");
        if (bVar5) {
          this->token_ = 0x18;
          return;
        }
        bVar5 = std::operator==(&this->attribute_,"");
        if (!bVar5) {
          bVar5 = std::operator==(&this->attribute_,"");
          if (bVar5) {
            this->token_ = 0x1a;
            return;
          }
          bVar5 = std::operator==(&this->attribute_,"");
          if (bVar5) {
            this->token_ = 0x1b;
            return;
          }
          bVar5 = std::operator==(&this->attribute_,"true");
          if ((bVar5) || (bVar5 = std::operator==(&this->attribute_,"false"), bVar5)) {
            bVar5 = std::operator==(&this->attribute_,"true");
            NumToString<bool>((string *)&start_2,bVar5);
            std::__cxx11::string::operator=((string *)&this->attribute_,(string *)&start_2);
            std::__cxx11::string::~string((string *)&start_2);
            this->token_ = 2;
            return;
          }
          bVar5 = std::operator==(&this->attribute_,"table");
          if (bVar5) {
            this->token_ = 5;
            return;
          }
          bVar5 = std::operator==(&this->attribute_,"struct");
          if (bVar5) {
            this->token_ = 6;
            return;
          }
          bVar5 = std::operator==(&this->attribute_,"enum");
          if (bVar5) {
            this->token_ = 7;
            return;
          }
          bVar5 = std::operator==(&this->attribute_,"union");
          if (bVar5) {
            this->token_ = 8;
            return;
          }
          bVar5 = std::operator==(&this->attribute_,"namespace");
          if (bVar5) {
            this->token_ = 9;
            return;
          }
          bVar5 = std::operator==(&this->attribute_,"root_type");
          if (!bVar5) {
            this->token_ = 4;
            return;
          }
          this->token_ = 10;
          return;
        }
        this->token_ = 0x19;
        return;
      }
      iVar4 = isdigit((uint)local_12);
      if ((iVar4 != 0) || (local_12 == 0x2d)) {
        ch.field_2._8_8_ = this->cursor_ + -1;
        while (iVar4 = isdigit((uint)(byte)*this->cursor_), iVar4 != 0) {
          this->cursor_ = this->cursor_ + 1;
        }
        if (*this->cursor_ == '.') {
          this->cursor_ = this->cursor_ + 1;
          while (iVar4 = isdigit((uint)(byte)*this->cursor_), iVar4 != 0) {
            this->cursor_ = this->cursor_ + 1;
          }
          this->token_ = 3;
        }
        else {
          this->token_ = 2;
        }
        std::__cxx11::string::clear();
        std::__cxx11::string::append<char_const*,void>
                  ((string *)&this->attribute_,(char *)ch.field_2._8_8_,this->cursor_);
        return;
      }
      std::__cxx11::string::string((string *)local_148);
      std::__cxx11::string::operator=((string *)local_148,local_12);
      if (((char)local_12 < ' ') || ('~' < (char)local_12)) {
        NumToString<char>(&local_188,local_12);
        std::operator+(&local_168,"code: ",&local_188);
        std::__cxx11::string::operator=((string *)local_148,(string *)&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
      }
      std::operator+(&local_1a8,"illegal character: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148)
      ;
      Error(&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)local_148);
      break;
    case 9:
    case 0xd:
    case 0x20:
      break;
    case 10:
      this->line_ = this->line_ + 1;
      local_11 = 1;
      break;
    case 0x22:
      std::__cxx11::string::operator=((string *)&this->attribute_,"");
      while (*this->cursor_ != '\"') {
        if ((*this->cursor_ < ' ') && (-1 < *this->cursor_)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_70,"illegal character in string constant",&local_71);
          Error(&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::allocator<char>::~allocator((allocator<char> *)&local_71);
        }
        if (*this->cursor_ == '\\') {
          this->cursor_ = this->cursor_ + 1;
          cVar1 = *this->cursor_;
          if (cVar1 == '\"') {
            std::__cxx11::string::operator+=((string *)&this->attribute_,'\"');
            this->cursor_ = this->cursor_ + 1;
          }
          else if (cVar1 == '\\') {
            std::__cxx11::string::operator+=((string *)&this->attribute_,'\\');
            this->cursor_ = this->cursor_ + 1;
          }
          else if (cVar1 == 'n') {
            std::__cxx11::string::operator+=((string *)&this->attribute_,'\n');
            this->cursor_ = this->cursor_ + 1;
          }
          else if (cVar1 == 'r') {
            std::__cxx11::string::operator+=((string *)&this->attribute_,'\r');
            this->cursor_ = this->cursor_ + 1;
          }
          else if (cVar1 == 't') {
            std::__cxx11::string::operator+=((string *)&this->attribute_,'\t');
            this->cursor_ = this->cursor_ + 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_98,"unknown escape code in string constant",
                       (allocator *)((long)&start + 7));
            Error(&local_98);
            std::__cxx11::string::~string((string *)&local_98);
            std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
          }
        }
        else {
          pcVar3 = this->cursor_;
          this->cursor_ = pcVar3 + 1;
          std::__cxx11::string::operator+=((string *)&this->attribute_,*pcVar3);
        }
      }
      this->cursor_ = this->cursor_ + 1;
      this->token_ = 1;
      return;
    case 0x28:
    case 0x29:
    case 0x5b:
    case 0x5d:
    case 0x7b:
    case 0x7d:
      return;
    case 0x2c:
    case 0x3a:
    case 0x3b:
    case 0x3d:
      return;
    case 0x2e:
      iVar4 = isdigit((int)*this->cursor_);
      if (iVar4 == 0) {
        return;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_38,"floating point constant can\'t start with \".\"",&local_39);
      Error(&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      break;
    case 0x2f:
      if (*this->cursor_ != '/') goto switchD_0012e7cf_caseD_1;
      local_a8 = this->cursor_ + 1;
      this->cursor_ = local_a8;
      while( true ) {
        bVar5 = false;
        if (*this->cursor_ != '\0') {
          bVar5 = *this->cursor_ != '\n';
        }
        if (!bVar5) break;
        this->cursor_ = this->cursor_ + 1;
      }
      if (*local_a8 == '/') {
        if ((local_11 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_c8,"a documentation comment should be on a line on its own",
                     &local_c9);
          Error(&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_c9);
        }
        __beg = local_a8 + 1;
        pcVar3 = this->cursor_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>
                  (local_f0,__beg,pcVar3,(allocator<char> *)((long)&start_1 + 7));
        std::__cxx11::string::operator+=((string *)&this->doc_comment_,local_f0);
        std::__cxx11::string::~string(local_f0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&start_1 + 7));
      }
    }
  } while( true );
}

Assistant:

void Parser::Next() {
  doc_comment_.clear();
  bool seen_newline = false;
  for (;;) {
    char c = *cursor_++;
    token_ = c;
    switch (c) {
      case '\0': cursor_--; token_ = kTokenEof; return;
      case ' ': case '\r': case '\t': break;
      case '\n': line_++; seen_newline = true; break;
      case '{': case '}': case '(': case ')': case '[': case ']': return;
      case ',': case ':': case ';': case '=': return;
      case '.':
        if(!isdigit(*cursor_)) return;
        Error("floating point constant can\'t start with \".\"");
        break;
      case '\"':
        attribute_ = "";
        while (*cursor_ != '\"') {
          if (*cursor_ < ' ' && *cursor_ >= 0)
            Error("illegal character in string constant");
          if (*cursor_ == '\\') {
            cursor_++;
            switch (*cursor_) {
              case 'n':  attribute_ += '\n'; cursor_++; break;
              case 't':  attribute_ += '\t'; cursor_++; break;
              case 'r':  attribute_ += '\r'; cursor_++; break;
              case '\"': attribute_ += '\"'; cursor_++; break;
              case '\\': attribute_ += '\\'; cursor_++; break;
              default: Error("unknown escape code in string constant"); break;
            }
          } else { // printable chars + UTF-8 bytes
            attribute_ += *cursor_++;
          }
        }
        cursor_++;
        token_ = kTokenStringConstant;
        return;
      case '/':
        if (*cursor_ == '/') {
          const char *start = ++cursor_;
          while (*cursor_ && *cursor_ != '\n') cursor_++;
          if (*start == '/') {  // documentation comment
            if (!seen_newline)
              Error("a documentation comment should be on a line on its own");
            // todo: do we want to support multiline comments instead?
            doc_comment_ += std::string(start + 1, cursor_);
          }
          break;
        }
        // fall thru
      default:
        if (isalpha(static_cast<unsigned char>(c))) {
          // Collect all chars of an identifier:
          const char *start = cursor_ - 1;
          while (isalnum(static_cast<unsigned char>(*cursor_)) ||
                 *cursor_ == '_')
            cursor_++;
          attribute_.clear();
          attribute_.append(start, cursor_);
          // First, see if it is a type keyword from the table of types:
          #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
            if (attribute_ == IDLTYPE) { \
              token_ = kToken ## ENUM; \
              return; \
            }
            FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
          #undef FLATBUFFERS_TD
          // If it's a boolean constant keyword, turn those into integers,
          // which simplifies our logic downstream.
          if (attribute_ == "true" || attribute_ == "false") {
            attribute_ = NumToString(attribute_ == "true");
            token_ = kTokenIntegerConstant;
            return;
          }
          // Check for declaration keywords:
          if (attribute_ == "table")     { token_ = kTokenTable;     return; }
          if (attribute_ == "struct")    { token_ = kTokenStruct;    return; }
          if (attribute_ == "enum")      { token_ = kTokenEnum;      return; }
          if (attribute_ == "union")     { token_ = kTokenUnion;     return; }
          if (attribute_ == "namespace") { token_ = kTokenNameSpace; return; }
          if (attribute_ == "root_type") { token_ = kTokenRootType;  return; }
          // If not, it is a user-defined identifier:
          token_ = kTokenIdentifier;
          return;
        } else if (isdigit(static_cast<unsigned char>(c)) || c == '-') {
          const char *start = cursor_ - 1;
          while (isdigit(static_cast<unsigned char>(*cursor_))) cursor_++;
          if (*cursor_ == '.') {
            cursor_++;
            while (isdigit(static_cast<unsigned char>(*cursor_))) cursor_++;
            token_ = kTokenFloatConstant;
          } else {
            token_ = kTokenIntegerConstant;
          }
          attribute_.clear();
          attribute_.append(start, cursor_);
          return;
        }
        std::string ch;
        ch = c;
        if (c < ' ' || c > '~') ch = "code: " + NumToString(c);
        Error("illegal character: " + ch);
        break;
    }
  }
}